

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# events.c
# Opt level: O3

void al_unref_user_event(ALLEGRO_USER_EVENT *event)

{
  ALLEGRO_USER_EVENT_DESCRIPTOR *ptr;
  _Bool _Var1;
  int iVar2;
  
  ptr = event->__internal__descr;
  if (ptr != (ALLEGRO_USER_EVENT_DESCRIPTOR *)0x0) {
    if (user_event_refcount_mutex.inited) {
      pthread_mutex_lock((pthread_mutex_t *)&user_event_refcount_mutex.mutex);
    }
    _Var1 = user_event_refcount_mutex.inited;
    iVar2 = ptr->refcount + -1;
    ptr->refcount = iVar2;
    if ((_Var1 & 1U) != 0) {
      pthread_mutex_unlock((pthread_mutex_t *)&user_event_refcount_mutex.mutex);
    }
    if (iVar2 == 0) {
      (*ptr->dtor)(event);
      al_free_with_context
                (ptr,0x2cf,
                 "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/src/events.c"
                 ,"al_unref_user_event");
      return;
    }
  }
  return;
}

Assistant:

void al_unref_user_event(ALLEGRO_USER_EVENT *event)
{
   ALLEGRO_USER_EVENT_DESCRIPTOR *descr;
   int refcount;

   ASSERT(event);

   descr = event->__internal__descr;
   if (descr) {
      _al_mutex_lock(&user_event_refcount_mutex);
      ASSERT(descr->refcount > 0);
      refcount = --descr->refcount;
      _al_mutex_unlock(&user_event_refcount_mutex);

      if (refcount == 0) {
         (descr->dtor)(event);
         al_free(descr);
      }
   }
}